

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pugixml.cpp
# Opt level: O0

xml_node __thiscall pugi::xml_node::previous_sibling(xml_node *this,char_t *name_)

{
  bool bVar1;
  long *in_RDI;
  char_t *iname;
  xml_node_struct *i;
  char_t *in_stack_ffffffffffffffc8;
  xml_node_struct *local_20;
  xml_node local_8;
  
  if (*in_RDI == 0) {
    xml_node(&local_8);
  }
  else {
    for (local_20 = *(xml_node_struct **)(*in_RDI + 0x28);
        local_20->next_sibling != (xml_node_struct *)0x0; local_20 = local_20->prev_sibling_c) {
      if ((local_20->name != (char_t *)0x0) &&
         (bVar1 = impl::anon_unknown_0::strequal((char_t *)in_RDI,in_stack_ffffffffffffffc8), bVar1)
         ) {
        xml_node(&local_8,local_20);
        return (xml_node)local_8._root;
      }
    }
    xml_node(&local_8);
  }
  return (xml_node)local_8._root;
}

Assistant:

PUGI_IMPL_FN xml_node xml_node::previous_sibling(const char_t* name_) const
	{
		if (!_root) return xml_node();

		for (xml_node_struct* i = _root->prev_sibling_c; i->next_sibling; i = i->prev_sibling_c)
		{
			const char_t* iname = i->name;
			if (iname && impl::strequal(name_, iname))
				return xml_node(i);
		}

		return xml_node();
	}